

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::assign
          (CImg<unsigned_char> *this,uchar *values,uint size_x,uint size_y,uint size_z,uint size_c,
          bool is_shared)

{
  long lVar1;
  CImg<unsigned_char> *pCVar2;
  
  lVar1 = (ulong)size_c * (ulong)size_z * (ulong)size_y * (ulong)size_x;
  if (values == (uchar *)0x0 || lVar1 == 0) {
    pCVar2 = assign(this);
    return pCVar2;
  }
  if (is_shared) {
    if (this->_is_shared == false) {
      if ((values + lVar1 < this->_data) ||
         (this->_data +
          (ulong)this->_depth * (ulong)this->_spectrum * (ulong)this->_height * (ulong)this->_width
          <= values)) {
        assign(this);
      }
      else {
        cimg::warn(
                  "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::assign(): Shared image instance has overlapping memory."
                  );
      }
    }
    this->_width = size_x;
    this->_height = size_y;
    this->_depth = size_z;
    this->_spectrum = size_c;
    this->_is_shared = true;
    this->_data = values;
    return this;
  }
  if (this->_is_shared != false) {
    assign(this);
  }
  assign(this,values,size_x,size_y,size_z,size_c);
  return this;
}

Assistant:

CImg<T>& assign(const T *const values, const unsigned int size_x, const unsigned int size_y,
                    const unsigned int size_z, const unsigned int size_c, const bool is_shared) {
      const unsigned long siz = (unsigned long)size_x*size_y*size_z*size_c;
      if (!values || !siz) return assign();
      if (!is_shared) { if (_is_shared) assign(); assign(values,size_x,size_y,size_z,size_c); }
      else {
	if (!_is_shared) {
	  if (values + siz<_data || values>=_data + size()) assign();
	  else cimg::warn(_cimg_instance
                          "assign(): Shared image instance has overlapping memory.",
                          cimg_instance);
	}
	_width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c; _is_shared = true;
	_data = const_cast<T*>(values);
      }
      return *this;
    }